

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.hpp
# Opt level: O2

char * soplex::getColName<double>(SPxLPBase<double> *lp,int idx,NameSet *cnames,char *buf)

{
  Item *pIVar1;
  SPxColId SVar2;
  
  if (cnames != (NameSet *)0x0) {
    SVar2 = SPxLPBase<double>::cId(lp,idx);
    pIVar1 = (cnames->set).theitem;
    if (-1 < pIVar1[(long)SVar2.super_DataKey >> 0x20].info) {
      return cnames->mem + pIVar1[(long)SVar2.super_DataKey >> 0x20].data;
    }
  }
  spxSnprintf(buf,0x10,"x%d",idx);
  return buf;
}

Assistant:

static const char* getColName(
   const SPxLPBase<R>*   lp,
   int            idx,
   const NameSet* cnames,
   char*          buf)
{
   assert(buf != nullptr);
   assert(idx >= 0);
   assert(idx < lp->nCols());

   if(cnames != nullptr)
   {
      DataKey key = lp->cId(idx);

      if(cnames->has(key))
         return (*cnames)[key];
   }

   spxSnprintf(buf, 16, "x%d", idx);

   return buf;
}